

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

void __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getColUnscaled(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *lp,int i,
                DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *vec)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  int i_00;
  Item *pIVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  long lVar6;
  long lVar7;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  undefined1 local_e4;
  undefined8 local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_80;
  
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
               *)vec,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)((lp->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.theitem +
                        (lp->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thekey[i].idx));
  iVar2 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).scaleExp.data[i];
  pIVar4 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar3 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[i].idx;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setMax(vec,pIVar4[iVar3].data.
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused);
  (vec->
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).memused = 0;
  if (0 < pIVar4[iVar3].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar6 = 0x50;
    lVar7 = 0;
    do {
      pNVar5 = pIVar4[iVar3].data.
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      i_00 = *(int *)((long)&(pNVar5->val).m_backend.data + lVar6);
      puVar1 = (undefined8 *)((long)(&pNVar5->val + -1) + lVar6);
      local_128 = *puVar1;
      uStack_120 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar6 + -0x40);
      local_118 = *puVar1;
      uStack_110 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar6 + -0x30);
      local_108 = *puVar1;
      uStack_100 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar6 + -0x20);
      local_f8 = *puVar1;
      uStack_f0 = puVar1[1];
      local_e8 = *(undefined4 *)((long)&(pNVar5->val).m_backend.data + lVar6 + -0x10);
      local_e4 = *(undefined1 *)((long)&(pNVar5->val).m_backend.data + lVar6 + -0xc);
      local_e0 = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar6 + -8);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                (&local_80,(soplex *)&local_128,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)(uint)-((lp->
                                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).scaleExp.data[i_00] + iVar2),
                 CONCAT31((int3)((uint)local_e8 >> 8),local_e4));
      local_d8.m_backend.data._M_elems[0xc] = local_80.m_backend.data._M_elems[0xc];
      local_d8.m_backend.data._M_elems[0xd] = local_80.m_backend.data._M_elems[0xd];
      local_d8.m_backend.data._M_elems[0xe] = local_80.m_backend.data._M_elems[0xe];
      local_d8.m_backend.data._M_elems[0xf] = local_80.m_backend.data._M_elems[0xf];
      local_d8.m_backend.data._M_elems[8] = local_80.m_backend.data._M_elems[8];
      local_d8.m_backend.data._M_elems[9] = local_80.m_backend.data._M_elems[9];
      local_d8.m_backend.data._M_elems[10] = local_80.m_backend.data._M_elems[10];
      local_d8.m_backend.data._M_elems[0xb] = local_80.m_backend.data._M_elems[0xb];
      local_d8.m_backend.data._M_elems[4] = local_80.m_backend.data._M_elems[4];
      local_d8.m_backend.data._M_elems[5] = local_80.m_backend.data._M_elems[5];
      local_d8.m_backend.data._M_elems[6] = local_80.m_backend.data._M_elems[6];
      local_d8.m_backend.data._M_elems[7] = local_80.m_backend.data._M_elems[7];
      local_d8.m_backend.data._M_elems[0] = local_80.m_backend.data._M_elems[0];
      local_d8.m_backend.data._M_elems[1] = local_80.m_backend.data._M_elems[1];
      local_d8.m_backend.data._M_elems[2] = local_80.m_backend.data._M_elems[2];
      local_d8.m_backend.data._M_elems[3] = local_80.m_backend.data._M_elems[3];
      local_d8.m_backend.exp = local_80.m_backend.exp;
      local_d8.m_backend.neg = local_80.m_backend.neg;
      local_d8.m_backend.fpclass = local_80.m_backend.fpclass;
      local_d8.m_backend.prec_elem = local_80.m_backend.prec_elem;
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add(vec,i_00,&local_d8);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x54;
    } while (lVar7 < pIVar4[iVar3].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused);
  }
  return;
}

Assistant:

void SPxScaler<R>::getColUnscaled(const SPxLPBase<R>& lp, int i, DSVectorBase<R>& vec) const
{
   assert(lp.isScaled());
   assert(i < lp.nCols());
   assert(i >= 0);
   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   vec = lp.LPColSetBase<R>::colVector(i);

   int exp1;
   int exp2 = colscaleExp[i];

   const SVectorBase<R>& col = lp.colVector(i);
   vec.setMax(col.size());
   vec.clear();

   for(int j = 0; j < col.size(); j++)
   {
      exp1 = rowscaleExp[col.index(j)];
      vec.add(col.index(j), spxLdexp(col.value(j), -exp1 - exp2));
   }
}